

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_toggle_behavior(nk_input *in,nk_rect select,nk_flags *state,int active)

{
  int iVar1;
  uint local_2c;
  int active_local;
  nk_flags *state_local;
  nk_input *in_local;
  nk_rect select_local;
  
  if ((*state & 2) == 0) {
    *state = 4;
  }
  else {
    *state = 6;
  }
  iVar1 = nk_button_behavior(state,select,in,NK_BUTTON_DEFAULT);
  local_2c = active;
  if (iVar1 != 0) {
    *state = 0x22;
    local_2c = (uint)((active != 0 ^ 0xffU) & 1);
  }
  if (((*state & 0x10) == 0) ||
     (iVar1 = nk_input_is_mouse_prev_hovering_rect(in,select), iVar1 != 0)) {
    iVar1 = nk_input_is_mouse_prev_hovering_rect(in,select);
    if (iVar1 != 0) {
      *state = *state | 0x40;
    }
  }
  else {
    *state = *state | 8;
  }
  return local_2c;
}

Assistant:

NK_LIB int
nk_toggle_behavior(const struct nk_input *in, struct nk_rect select,
    nk_flags *state, int active)
{
    nk_widget_state_reset(state);
    if (nk_button_behavior(state, select, in, NK_BUTTON_DEFAULT)) {
        *state = NK_WIDGET_STATE_ACTIVE;
        active = !active;
    }
    if (*state & NK_WIDGET_STATE_HOVER && !nk_input_is_mouse_prev_hovering_rect(in, select))
        *state |= NK_WIDGET_STATE_ENTERED;
    else if (nk_input_is_mouse_prev_hovering_rect(in, select))
        *state |= NK_WIDGET_STATE_LEFT;
    return active;
}